

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageSizeTests.cpp
# Opt level: O3

GLuint __thiscall
glcts::anon_unknown_0::ImageSizeMachine::CreateComputeProgram(ImageSizeMachine *this,string *cs)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint program;
  GLuint shader;
  pointer pcVar2;
  char *pcVar3;
  char *src [2];
  char *local_38;
  pointer local_30;
  
  this_00 = &(this->super_GLWrapper).super_CallLogWrapper;
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  if (cs->_M_string_length != 0) {
    shader = glu::CallLogWrapper::glCreateShader(this_00,0x91b9);
    glu::CallLogWrapper::glAttachShader(this_00,program,shader);
    glu::CallLogWrapper::glDeleteShader(this_00,shader);
    local_38 = 
    "#version 310 es\n\nprecision highp float;\nprecision highp int;\nprecision highp image2D;\nprecision highp image3D;\nprecision highp imageCube;\nprecision highp image2DArray;\nprecision highp iimage2D;\nprecision highp iimage3D;\nprecision highp iimageCube;\nprecision highp iimage2DArray;\nprecision highp uimage2D;\nprecision highp uimage3D;\nprecision highp uimageCube;\nprecision highp uimage2DArray;"
    ;
    local_30 = (cs->_M_dataplus)._M_p;
    glu::CallLogWrapper::glShaderSource(this_00,shader,2,&local_38,(GLint *)0x0);
    bVar1 = CompileShader(this,shader);
    pcVar2 = local_30;
    pcVar3 = local_38;
    if (!bVar1) goto LAB_00c6814a;
  }
  bVar1 = LinkProgram(this,program);
  if (bVar1) {
    return program;
  }
  if (cs->_M_string_length == 0) {
    return program;
  }
  pcVar2 = (cs->_M_dataplus)._M_p;
  pcVar3 = 
  "#version 310 es\n\nprecision highp float;\nprecision highp int;\nprecision highp image2D;\nprecision highp image3D;\nprecision highp imageCube;\nprecision highp image2DArray;\nprecision highp iimage2D;\nprecision highp iimage3D;\nprecision highp iimageCube;\nprecision highp iimage2DArray;\nprecision highp uimage2D;\nprecision highp uimage3D;\nprecision highp uimageCube;\nprecision highp uimage2DArray;"
  ;
LAB_00c6814a:
  anon_unknown_0::Output("%s%s\n",pcVar3,pcVar2);
  return program;
}

Assistant:

GLuint CreateComputeProgram(const std::string& cs)
	{
		const GLuint p = glCreateProgram();

		if (!cs.empty())
		{
			const GLuint sh = glCreateShader(GL_COMPUTE_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			const char* const src[2] = { kGLSLVer, cs.c_str() };
			glShaderSource(sh, 2, src, NULL);
			if (!CompileShader(sh))
			{
				Output("%s%s\n", src[0], src[1]);
				return p;
			}
		}
		if (!LinkProgram(p))
		{
			if (!cs.empty())
				Output("%s%s\n", kGLSLVer, cs.c_str());
			return p;
		}

		return p;
	}